

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::checkElemTimeScale
          (Compilation *this,optional<slang::TimeScale> timeScale,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  Compilation *this_00;
  pointer this_01;
  type *ppPVar2;
  SyntaxNode *pSVar3;
  undefined8 in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RDI;
  Scope *in_stack_00000038;
  undefined1 in_stack_00000040 [16];
  SyntaxNode *syntax_1;
  type *package;
  type *name;
  iterator __end3_1;
  iterator __begin3_1;
  flat_hash_map<std::string_view,_const_PackageSymbol_*> *__range3_1;
  ModuleDeclarationSyntax *syntax;
  unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_> *def;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  *__range3;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  *in_stack_fffffffffffffef8;
  _Storage<slang::TimeScale,_true> in_stack_ffffffffffffff20;
  _Storage<slang::TimeScale,_true> _Var4;
  undefined4 in_stack_ffffffffffffff24;
  __normal_iterator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
  local_30;
  SourceLocation SVar5;
  
  SVar5 = in_RDI;
  bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x3421c0);
  if (bVar1) {
    if ((*(byte *)((long)in_RDI + 0x4da) & 1) == 0) {
      *(undefined1 *)((long)in_RDI + 0x4da) = 1;
      this_00 = (Compilation *)((long)in_RDI + 0x400);
      local_30._M_current =
           (unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
            *)std::
              vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
              ::begin((vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
                       *)in_stack_fffffffffffffef8);
      std::
      vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
      ::end((vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
             *)in_stack_fffffffffffffef8);
      while (bVar1 = __gnu_cxx::
                     operator==<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
                               ((__normal_iterator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
                                 *)in_RDI,
                                (__normal_iterator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
                                 *)in_stack_fffffffffffffef8), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
        ::operator*(&local_30);
        this_01 = std::
                  unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                  ::operator->((unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                                *)0x342262);
        pSVar3 = Symbol::getSyntax(&this_01->super_Symbol);
        slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>(pSVar3);
        std::
        unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
        ::operator->((unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                      *)0x342287);
        not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                  ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x3422ac);
        parsing::Token::range
                  ((Token *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        sourceRange_00.endLoc = in_RDX;
        sourceRange_00.startLoc = SVar5;
        checkElemTimeScale(this_00,(_Optional_base<slang::TimeScale,_true,_true>)
                                   SUB85((ulong)in_RCX >> 0x18,0),sourceRange_00);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_*,_std::vector<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>_>
        ::operator++(&local_30);
      }
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
      ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
               *)0x342347);
      boost::unordered::
      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
             *)0x342364);
      while (bVar1 = boost::unordered::detail::foa::operator!=
                               ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                 *)in_RDI,in_stack_fffffffffffffef8), bVar1) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     *)0x342399);
        std::
        get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
                    *)0x3423bd);
        ppPVar2 = std::
                  get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>
                            ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>
                              *)0x3423cc);
        pSVar3 = Symbol::getSyntax(&(*ppPVar2)->super_Symbol);
        if (pSVar3 != (SyntaxNode *)0x0) {
          bVar1 = ((*ppPVar2)->timeScale).super__Optional_base<slang::TimeScale,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::TimeScale>._M_engaged;
          _Var4 = ((*ppPVar2)->timeScale).super__Optional_base<slang::TimeScale,_true,_true>.
                  _M_payload.super__Optional_payload_base<slang::TimeScale>._M_payload;
          slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>(pSVar3);
          not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->
                    ((not_null<slang::syntax::ModuleHeaderSyntax_*> *)0x34241d);
          parsing::Token::range
                    ((Token *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          in_stack_ffffffffffffff24 = CONCAT31((int3)((uint)in_stack_ffffffffffffff24 >> 8),bVar1);
          sourceRange_01.endLoc = in_RDX;
          sourceRange_01.startLoc = SVar5;
          checkElemTimeScale(this_00,(_Optional_base<slang::TimeScale,_true,_true>)
                                     SUB85((ulong)in_RCX >> 0x18,0),sourceRange_01);
          in_stack_ffffffffffffff20 = _Var4;
        }
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_RDI);
      }
    }
  }
  else if ((*(byte *)((long)in_RDI + 0x4da) & 1) != 0) {
    std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::
    operator->((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
               0x34249d);
    Scope::addDiag(in_stack_00000038,package._4_4_,(SourceRange)in_stack_00000040);
  }
  return;
}

Assistant:

void Compilation::checkElemTimeScale(std::optional<TimeScale> timeScale, SourceRange sourceRange) {
    if (timeScale) {
        if (anyElemsWithTimescales)
            return;

        anyElemsWithTimescales = true;
        for (auto& def : definitionMemory) {
            auto& syntax = def->getSyntax()->as<ModuleDeclarationSyntax>();
            checkElemTimeScale(def->timeScale, syntax.header->name.range());
        }

        for (auto [name, package] : packageMap) {
            if (auto syntax = package->getSyntax()) {
                checkElemTimeScale(package->timeScale,
                                   syntax->as<ModuleDeclarationSyntax>().header->name.range());
            }
        }
    }
    else if (anyElemsWithTimescales) {
        root->addDiag(diag::MissingTimeScale, sourceRange);
    }
}